

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.hpp
# Opt level: O2

void __thiscall limonp::Logger::Logger(Logger *this,size_t level,char *filename,int lineno)

{
  tm *__tp;
  ostream *poVar1;
  time_t now;
  char buf [32];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->level_ = level;
  if (level < 6) {
    time(&now);
    __tp = localtime(&now);
    strftime(buf,0x20,"%Y-%m-%d %H:%M:%S",__tp);
    poVar1 = std::operator<<((ostream *)this,buf);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,filename);
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,lineno);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,_ZN6limonpL15LOG_LEVEL_ARRAYE_rel +
                                    *(int *)(_ZN6limonpL15LOG_LEVEL_ARRAYE_rel + this->level_ * 4));
    std::operator<<(poVar1," ");
    return;
  }
  __assert_fail("level_ <= sizeof(LOG_LEVEL_ARRAY)/sizeof(*LOG_LEVEL_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/Logging.hpp"
                ,0x2a,"limonp::Logger::Logger(size_t, const char *, int)");
}

Assistant:

Logger(size_t level, const char* filename, int lineno)
   : level_(level) {
#ifdef LOGGING_LEVEL
     if (level_ < LOGGING_LEVEL) {
       return;
     }
#endif
    assert(level_ <= sizeof(LOG_LEVEL_ARRAY)/sizeof(*LOG_LEVEL_ARRAY));
    char buf[32];
    time_t now;
    time(&now);
    strftime(buf, sizeof(buf), LOG_TIME_FORMAT, localtime(&now));
    stream_ << buf 
      << " " << filename 
      << ":" << lineno 
      << " " << LOG_LEVEL_ARRAY[level_] 
      << " ";
  }